

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O2

void __thiscall chrono::ChShaft::ChShaft(ChShaft *this)

{
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaft_0116db58;
  (this->super_ChLoadable)._vptr_ChLoadable = (_func_int **)&PTR__ChShaft_0116dda0;
  this->torque = 0.0;
  this->pos = 0.0;
  this->pos_dt = 0.0;
  this->pos_dtdt = 0.0;
  this->inertia = 1.0;
  ChVariablesShaft::ChVariablesShaft(&this->variables);
  this->max_speed = 10.0;
  this->sleep_time = 0.6;
  this->sleep_minspeed = 0.1;
  this->sleep_minwvel = 0.04;
  this->sleep_starttime = 0.0;
  *(undefined4 *)((long)&this->sleep_starttime + 3) = 0;
  this->use_sleeping = true;
  (this->variables).m_shaft = this;
  return;
}

Assistant:

ChShaft::ChShaft()
    : torque(0),
      pos(0),
      pos_dt(0),
      pos_dtdt(0),
      inertia(1),
      max_speed(10.0f),
      sleep_time(0.6f),
      sleep_minspeed(0.1f),
      sleep_minwvel(0.04f),
      sleep_starttime(0),
      fixed(false),
      limitspeed(false),
      sleeping(false) {
    SetUseSleeping(true);
    variables.SetShaft(this);
}